

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

char * archive_acl_to_text_l
                 (archive_acl *acl,ssize_t *text_len,wchar_t flags,archive_string_conv *sc)

{
  char *pcVar1;
  wchar_t wVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  char cVar7;
  uint uVar8;
  archive_acl_entry *paVar9;
  int iVar10;
  wchar_t want_type;
  char *p;
  undefined4 local_64;
  char *local_60;
  size_t local_58;
  archive_string_conv *local_50;
  size_t *local_48;
  char *name;
  size_t len;
  
  if ((acl->acl_types & 0x3c00U) == 0) {
    want_type = flags & 0x300U;
    if ((flags & 0x300U) == L'\0') {
      want_type = L'̀';
    }
  }
  else {
    want_type = L'㰀';
    if ((acl->acl_types & 0x300U) != 0) {
      want_type = L'\0';
    }
  }
  if (want_type != L'\0') {
    if (want_type == L'̀') {
      flags = flags | 2;
    }
    local_50 = sc;
    local_48 = (size_t *)text_len;
    local_58 = archive_acl_text_len(acl,want_type,flags,L'\0',(archive *)0x0,sc);
    if (local_58 == 0) {
      return (char *)0x0;
    }
    local_64 = 0x2c;
    if ((flags & 8U) == 0) {
      local_64 = 10;
    }
    pcVar3 = (char *)malloc(local_58);
    p = pcVar3;
    if (pcVar3 == (char *)0x0) {
      piVar6 = __errno_location();
      if (*piVar6 != 0xc) {
        return (char *)0x0;
      }
      pcVar3 = "No memory";
    }
    else {
      iVar10 = 0;
      local_60 = pcVar3;
      if (((uint)want_type >> 8 & 1) != 0) {
        uVar8 = acl->mode;
        builtin_strncpy(pcVar3,"user",5);
        sVar4 = strlen(pcVar3);
        pcVar3[sVar4] = ':';
        pcVar3[sVar4 + 1] = ':';
        cVar7 = 'r';
        if ((uVar8 >> 8 & 1) == 0) {
          cVar7 = '-';
        }
        pcVar3[sVar4 + 2] = cVar7;
        cVar7 = 'w';
        if (-1 < (char)uVar8) {
          cVar7 = '-';
        }
        pcVar3[sVar4 + 3] = cVar7;
        cVar7 = 'x';
        if ((uVar8 & 0x40) == 0) {
          cVar7 = '-';
        }
        pcVar3[sVar4 + 4] = cVar7;
        p = pcVar3 + sVar4 + 6;
        pcVar3[sVar4 + 5] = (char)local_64;
        pcVar1 = pcVar3 + sVar4 + 6;
        pcVar1[0] = 'g';
        pcVar1[1] = 'r';
        pcVar1[2] = 'o';
        pcVar1[3] = 'u';
        (pcVar3 + sVar4 + 10)[0] = 'p';
        (pcVar3 + sVar4 + 10)[1] = '\0';
        sVar5 = strlen(p);
        pcVar3[sVar5 + sVar4 + 6] = ':';
        pcVar3[sVar5 + sVar4 + 7] = ':';
        cVar7 = 'r';
        if ((uVar8 & 0x20) == 0) {
          cVar7 = '-';
        }
        pcVar3[sVar5 + sVar4 + 8] = cVar7;
        cVar7 = 'w';
        if ((uVar8 & 0x10) == 0) {
          cVar7 = '-';
        }
        pcVar3[sVar5 + sVar4 + 9] = cVar7;
        cVar7 = 'x';
        if ((uVar8 & 8) == 0) {
          cVar7 = '-';
        }
        pcVar3[sVar5 + sVar4 + 10] = cVar7;
        p = pcVar3 + sVar5 + 0xc + sVar4;
        p[-1] = (char)local_64;
        append_entry(&p,(char *)0x0,L'Ā',L'✖',flags,(char *)0x0,acl->mode & 7,L'\xffffffff');
        iVar10 = 3;
      }
      paVar9 = acl->acl_head;
      if (paVar9 != (archive_acl_entry *)0x0) {
        do {
          wVar2 = paVar9->type;
          if (((wVar2 & want_type) != 0) &&
             (((wVar2 != L'Ā' || (uVar8 = paVar9->tag + L'\xffffd8ee', 4 < uVar8)) ||
              ((0x15U >> (uVar8 & 0x1f) & 1) == 0)))) {
            pcVar3 = (char *)0x0;
            if (wVar2 == L'Ȁ') {
              pcVar3 = "default:";
            }
            if ((flags & 2U) == 0) {
              pcVar3 = (char *)0x0;
            }
            wVar2 = archive_mstring_get_mbs_l(&paVar9->name,&name,&len,local_50);
            if (wVar2 != L'\0') {
              return (char *)0x0;
            }
            if (0 < iVar10) {
              *p = (char)local_64;
              p = p + 1;
            }
            wVar2 = L'\xffffffff';
            if ((flags & 1U) != 0 || name == (char *)0x0) {
              wVar2 = paVar9->id;
            }
            append_entry(&p,pcVar3,paVar9->type,paVar9->tag,flags,name,paVar9->permset,wVar2);
            iVar10 = iVar10 + 1;
          }
          paVar9 = paVar9->next;
        } while (paVar9 != (archive_acl_entry *)0x0);
      }
      pcVar3 = local_60;
      *p = '\0';
      p = p + 1;
      len = strlen(local_60);
      if ((long)len < (long)local_58) {
        if (local_48 != (size_t *)0x0) {
          *local_48 = len;
          return pcVar3;
        }
        return pcVar3;
      }
      pcVar3 = "Buffer overrun";
    }
    __archive_errx(1,pcVar3);
  }
  return (char *)0x0;
}

Assistant:

char *
archive_acl_to_text_l(struct archive_acl *acl, ssize_t *text_len, int flags,
    struct archive_string_conv *sc)
{
	int count;
	ssize_t length;
	size_t len;
	const char *name;
	const char *prefix;
	char separator;
	struct archive_acl_entry *ap;
	int id, r, want_type;
	char *p, *s;

	want_type = archive_acl_text_want_type(acl, flags);

	/* Both NFSv4 and POSIX.1 types found */
	if (want_type == 0)
		return (NULL);

	if (want_type == ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)
		flags |= ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT;

	length = archive_acl_text_len(acl, want_type, flags, 0, NULL, sc);

	if (length == 0)
		return (NULL);

	if (flags & ARCHIVE_ENTRY_ACL_STYLE_SEPARATOR_COMMA)
		separator = ',';
	else
		separator = '\n';

	/* Now, allocate the string and actually populate it. */
	p = s = (char *)malloc(length * sizeof(char));
	if (p == NULL) {
		if (errno == ENOMEM)
			__archive_errx(1, "No memory");
		return (NULL);
	}
	count = 0;

	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_USER_OBJ, flags, NULL,
		    acl->mode & 0700, -1);
		*p++ = separator;
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_GROUP_OBJ, flags, NULL,
		    acl->mode & 0070, -1);
		*p++ = separator;
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_OTHER, flags, NULL,
		    acl->mode & 0007, -1);
		count += 3;
	}

	for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
		if ((ap->type & want_type) == 0)
			continue;
		/*
		 * Filemode-mapping ACL entries are stored exclusively in
		 * ap->mode so they should not be in the list
		 */
		if ((ap->type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_USER_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_OTHER))
			continue;
		if (ap->type == ARCHIVE_ENTRY_ACL_TYPE_DEFAULT &&
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) != 0)
			prefix = "default:";
		else
			prefix = NULL;
		r = archive_mstring_get_mbs_l(
		    &ap->name, &name, &len, sc);
		if (r != 0)
			return (NULL);
		if (count > 0)
			*p++ = separator;
		if (name == NULL ||
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)) {
			id = ap->id;
		} else {
			id = -1;
		}
		append_entry(&p, prefix, ap->type, ap->tag, flags, name,
		    ap->permset, id);
		count++;
	}

	/* Add terminating character */
	*p++ = '\0';

	len = strlen(s);

	if ((ssize_t)len > (length - 1))
		__archive_errx(1, "Buffer overrun");

	if (text_len != NULL)
		*text_len = len;

	return (s);
}